

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<1,_458>::ThermalPointComponents::ThermalPointComponents
          (ThermalPointComponents *this,array<double,_2UL> *efr,array<double,_2UL> *enp,
          array<double,_2UL> *end,array<double,_2UL> *egp,array<double,_2UL> *egd,
          array<double,_2UL> *eb,array<double,_2UL> *enu,array<double,_2UL> *er,
          array<double,_2UL> *et)

{
  initializer_list<double> __l;
  allocator_type local_109;
  vector<double,_std::allocator<double>_> local_108;
  ListRecord local_f0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  double dStack_20;
  
  local_a8 = efr->_M_elems[0];
  dStack_a0 = efr->_M_elems[1];
  local_98 = enp->_M_elems[0];
  dStack_90 = enp->_M_elems[1];
  local_88 = end->_M_elems[0];
  dStack_80 = end->_M_elems[1];
  local_78 = egp->_M_elems[0];
  dStack_70 = egp->_M_elems[1];
  local_68 = egd->_M_elems[0];
  dStack_60 = egd->_M_elems[1];
  local_58 = eb->_M_elems[0];
  dStack_50 = eb->_M_elems[1];
  local_48 = enu->_M_elems[0];
  dStack_40 = enu->_M_elems[1];
  local_38 = er->_M_elems[0];
  dStack_30 = er->_M_elems[1];
  local_28 = et->_M_elems[0];
  dStack_20 = et->_M_elems[1];
  __l._M_len = 0x12;
  __l._M_array = &local_a8;
  std::vector<double,_std::allocator<double>_>::vector(&local_108,__l,&local_109);
  local_f0.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl =
       (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_f0.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)9;
  local_f0.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = 0;
  local_f0.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 0
  ;
  local_f0.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = 0.0;
  local_f0.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = 0.0;
  local_f0.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_f0.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_f0.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ThermalPointComponents(this,&local_f0);
  if (local_f0.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

ThermalPointComponents( std::array< double, 2 >&& efr,
                        std::array< double, 2 >&& enp,
                        std::array< double, 2 >&& end,
                        std::array< double, 2 >&& egp,
                        std::array< double, 2 >&& egd,
                        std::array< double, 2 >&& eb,
                        std::array< double, 2 >&& enu,
                        std::array< double, 2 >&& er,
                        std::array< double, 2 >&& et )
  try : ThermalPointComponents(
          ListRecord( 0.0, 0.0, 0, 0, 9,
                      { efr[0], efr[1], enp[0], enp[1], end[0], end[1],
                        egp[0], egp[1], egd[0], egd[1], eb[0], eb[1],
                        enu[0], enu[1], er[0], er[1], et[0], et[1] } ) ) {}
  catch ( std::exception& e ) {

    Log::info( "Encountered error while constructing a thermal point "
               "evaluation" );
    throw;
  }